

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::OpenPopupEx(ImGuiID id)

{
  ImVector<ImGuiPopupRef> *this;
  int i;
  int iVar1;
  ImGuiContext *pIVar2;
  value_type_conflict5 *pvVar3;
  value_type *pvVar4;
  value_type local_58;
  
  pIVar2 = GImGui;
  local_58.ParentWindow = GImGui->CurrentWindow;
  i = (GImGui->CurrentPopupStack).Size;
  local_58.Window = (ImGuiWindow *)0x0;
  iVar1 = GImGui->FrameCount;
  local_58.PopupId = id;
  local_58.OpenFrameCount = iVar1;
  pvVar3 = ImVector<unsigned_int>::back(&(local_58.ParentWindow)->IDStack);
  local_58.OpenParentId = *pvVar3;
  local_58.OpenMousePos = (pIVar2->IO).MousePos;
  local_58.OpenPopupPos = NavCalcPreferredRefPos();
  this = &pIVar2->OpenPopupStack;
  if (i < (pIVar2->OpenPopupStack).Size) {
    ImVector<ImGuiPopupRef>::resize(this,i + 1);
    pvVar4 = ImVector<ImGuiPopupRef>::operator[](this,i);
    if ((pvVar4->PopupId == id) &&
       (pvVar4 = ImVector<ImGuiPopupRef>::operator[](this,i),
       pvVar4->OpenFrameCount == pIVar2->FrameCount + -1)) {
      pvVar4 = ImVector<ImGuiPopupRef>::operator[](this,i);
      pvVar4->OpenFrameCount = iVar1;
      return;
    }
    pvVar4 = ImVector<ImGuiPopupRef>::operator[](this,i);
    *(ulong *)pvVar4 = CONCAT44(local_58._4_4_,local_58.PopupId);
    pvVar4->Window = local_58.Window;
    pvVar4->ParentWindow = local_58.ParentWindow;
    pvVar4->OpenFrameCount = local_58.OpenFrameCount;
    pvVar4->OpenParentId = local_58.OpenParentId;
    pvVar4->OpenPopupPos = local_58.OpenPopupPos;
    pvVar4->OpenMousePos = local_58.OpenMousePos;
  }
  else {
    ImVector<ImGuiPopupRef>::push_back(this,&local_58);
  }
  return;
}

Assistant:

void ImGui::OpenPopupEx(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* parent_window = g.CurrentWindow;
    int current_stack_size = g.CurrentPopupStack.Size;
    ImGuiPopupRef popup_ref; // Tagged as new ref as Window will be set back to NULL if we write this into OpenPopupStack.
    popup_ref.PopupId = id;
    popup_ref.Window = NULL;
    popup_ref.ParentWindow = parent_window;
    popup_ref.OpenFrameCount = g.FrameCount;
    popup_ref.OpenParentId = parent_window->IDStack.back();
    popup_ref.OpenMousePos = g.IO.MousePos;
    popup_ref.OpenPopupPos = NavCalcPreferredRefPos();

    //printf("[%05d] OpenPopupEx(0x%08X)\n", g.FrameCount, id);
    if (g.OpenPopupStack.Size < current_stack_size + 1)
    {
        g.OpenPopupStack.push_back(popup_ref);
    }
    else
    {
        // Close child popups if any
        g.OpenPopupStack.resize(current_stack_size + 1);

        // Gently handle the user mistakenly calling OpenPopup() every frame. It is a programming mistake! However, if we were to run the regular code path, the ui
        // would become completely unusable because the popup will always be in hidden-while-calculating-size state _while_ claiming focus. Which would be a very confusing
        // situation for the programmer. Instead, we silently allow the popup to proceed, it will keep reappearing and the programming error will be more obvious to understand.
        if (g.OpenPopupStack[current_stack_size].PopupId == id && g.OpenPopupStack[current_stack_size].OpenFrameCount == g.FrameCount - 1)
            g.OpenPopupStack[current_stack_size].OpenFrameCount = popup_ref.OpenFrameCount;
        else
            g.OpenPopupStack[current_stack_size] = popup_ref;

        // When reopening a popup we first refocus its parent, otherwise if its parent is itself a popup it would get closed by ClosePopupsOverWindow().
        // This is equivalent to what ClosePopupToLevel() does.
        //if (g.OpenPopupStack[current_stack_size].PopupId == id)
        //    FocusWindow(parent_window);
    }
}